

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::QuantizationParams::ByteSizeLong(QuantizationParams *this)

{
  LookUpTableQuantizationParams *pLVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (this->numberofbits_ == 0) {
    sVar7 = 0;
  }
  else {
    uVar5 = this->numberofbits_ | 1;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar7 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0x66) {
    pLVar1 = (this->QuantizationType_).lookuptablequantization_;
    uVar5 = (ulong)(uint)(pLVar1->floatvalue_).current_size_;
    lVar3 = uVar5 * 4;
    if (uVar5 == 0) {
      uVar4 = 0;
      uVar5 = 0;
    }
    else {
      uVar4 = (uint)lVar3;
      if ((int)uVar4 < 0) {
        uVar5 = 0xb;
      }
      else {
        iVar2 = 0x1f;
        if ((uVar4 | 1) != 0) {
          for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
    }
    pLVar1->_floatvalue_cached_byte_size_ = uVar4;
    sVar6 = uVar5 + lVar3;
    pLVar1->_cached_size_ = (uint)sVar6;
    uVar4 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
  }
  else {
    if (this->_oneof_case_[0] != 0x65) goto LAB_00223aa4;
    sVar6 = LinearQuantizationParams::ByteSizeLong((this->QuantizationType_).linearquantization_);
    uVar4 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
  }
  sVar7 = sVar7 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_00223aa4:
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t QuantizationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.QuantizationParams)
  size_t total_size = 0;

  // uint64 numberOfBits = 1;
  if (this->numberofbits() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numberofbits());
  }

  switch (QuantizationType_case()) {
    // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
    case kLinearQuantization: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *QuantizationType_.linearquantization_);
      break;
    }
    // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
    case kLookupTableQuantization: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *QuantizationType_.lookuptablequantization_);
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}